

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcWindowSizeAfterConstraint(ImGuiWindow *window,ImVec2 *size_desired)

{
  ImGuiSizeCallback p_Var1;
  ImGuiContext *pIVar2;
  ImGuiContext *g;
  ImGuiWindow *window_for_height;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  float fVar10;
  float fVar11;
  ImGuiSizeCallbackData data;
  float local_48;
  float fStack_44;
  ImGuiSizeCallbackData local_38;
  
  pIVar2 = GImGui;
  IVar9 = *size_desired;
  if (((GImGui->NextWindowData).Flags & 0x10) != 0) {
    fVar6 = (GImGui->NextWindowData).SizeConstraintRect.Min.x;
    fVar5 = (GImGui->NextWindowData).SizeConstraintRect.Min.y;
    fVar10 = IVar9.x;
    fVar7 = IVar9.y;
    if ((fVar6 < 0.0) || (fVar11 = (GImGui->NextWindowData).SizeConstraintRect.Max.x, fVar11 < 0.0))
    {
      fVar6 = (window->SizeFull).x;
    }
    else {
      if (fVar10 <= fVar11) {
        fVar11 = fVar10;
      }
      fVar6 = (float)(-(uint)(fVar10 < fVar6) & (uint)fVar6 |
                     ~-(uint)(fVar10 < fVar6) & (uint)fVar11);
    }
    if ((fVar5 < 0.0) || (fVar10 = (GImGui->NextWindowData).SizeConstraintRect.Max.y, fVar10 < 0.0))
    {
      fVar5 = (window->SizeFull).y;
    }
    else {
      if (fVar7 <= fVar10) {
        fVar10 = fVar7;
      }
      fVar5 = (float)(-(uint)(fVar7 < fVar5) & (uint)fVar5 | ~-(uint)(fVar7 < fVar5) & (uint)fVar10)
      ;
    }
    IVar8.y = fVar5;
    IVar8.x = fVar6;
    p_Var1 = (GImGui->NextWindowData).SizeCallback;
    if (p_Var1 != (ImGuiSizeCallback)0x0) {
      local_38.UserData = (GImGui->NextWindowData).SizeCallbackUserData;
      local_38.Pos = window->Pos;
      local_38.CurrentSize = window->SizeFull;
      local_38.DesiredSize = IVar8;
      (*p_Var1)(&local_38);
      IVar8 = local_38.DesiredSize;
    }
    IVar9.x = (float)(int)IVar8.x;
    IVar9.y = (float)(int)IVar8.y;
  }
  if ((window->Flags & 0x1000040U) == 0) {
    fVar6 = 0.0;
    if ((window->Flags & 1U) == 0) {
      fVar6 = GImGui->FontBaseSize * window->FontWindowScale;
      if (window->ParentWindow != (ImGuiWindow *)0x0) {
        fVar6 = fVar6 * window->ParentWindow->FontWindowScale;
      }
      fVar5 = (GImGui->Style).FramePadding.y;
      fVar6 = fVar5 + fVar5 + fVar6;
    }
    fVar7 = ImGuiWindow::MenuBarHeight(window);
    fVar5 = (pIVar2->Style).WindowMinSize.x;
    local_48 = IVar9.x;
    fStack_44 = IVar9.y;
    uVar3 = -(uint)(fVar5 <= local_48);
    fVar10 = (pIVar2->Style).WindowMinSize.y;
    uVar4 = -(uint)(fVar10 <= fStack_44);
    fVar11 = (float)(~uVar4 & (uint)fVar10 | (uint)fStack_44 & uVar4);
    fVar10 = (pIVar2->Style).WindowRounding + -1.0;
    fVar6 = (float)(~-(uint)(fVar10 <= 0.0) & (uint)fVar10) + fVar7 + fVar6;
    uVar4 = -(uint)(fVar6 <= fVar11);
    IVar9.y = (float)(~uVar4 & (uint)fVar6 | uVar4 & (uint)fVar11);
    IVar9.x = (float)(~uVar3 & (uint)fVar5 | uVar3 & (uint)local_48);
  }
  return IVar9;
}

Assistant:

static ImVec2 CalcWindowSizeAfterConstraint(ImGuiWindow* window, const ImVec2& size_desired)
{
    ImGuiContext& g = *GImGui;
    ImVec2 new_size = size_desired;
    if (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint)
    {
        // Using -1,-1 on either X/Y axis to preserve the current size.
        ImRect cr = g.NextWindowData.SizeConstraintRect;
        new_size.x = (cr.Min.x >= 0 && cr.Max.x >= 0) ? ImClamp(new_size.x, cr.Min.x, cr.Max.x) : window->SizeFull.x;
        new_size.y = (cr.Min.y >= 0 && cr.Max.y >= 0) ? ImClamp(new_size.y, cr.Min.y, cr.Max.y) : window->SizeFull.y;
        if (g.NextWindowData.SizeCallback)
        {
            ImGuiSizeCallbackData data;
            data.UserData = g.NextWindowData.SizeCallbackUserData;
            data.Pos = window->Pos;
            data.CurrentSize = window->SizeFull;
            data.DesiredSize = new_size;
            g.NextWindowData.SizeCallback(&data);
            new_size = data.DesiredSize;
        }
        new_size.x = IM_FLOOR(new_size.x);
        new_size.y = IM_FLOOR(new_size.y);
    }

    // Minimum size
    if (!(window->Flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_AlwaysAutoResize)))
    {
        ImGuiWindow* window_for_height = window;
        const float decoration_up_height = window_for_height->TitleBarHeight() + window_for_height->MenuBarHeight();
        new_size = ImMax(new_size, g.Style.WindowMinSize);
        new_size.y = ImMax(new_size.y, decoration_up_height + ImMax(0.0f, g.Style.WindowRounding - 1.0f)); // Reduce artifacts with very small windows
    }
    return new_size;
}